

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O0

void __thiscall
QSyntaxHighlighter::setFormat(QSyntaxHighlighter *this,int start,int count,QTextCharFormat *format)

{
  QSyntaxHighlighterPrivate *pQVar1;
  qsizetype qVar2;
  Promoted<int,_long_long> PVar3;
  QList<QTextCharFormat> *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  int i;
  int end;
  QSyntaxHighlighterPrivate *d;
  QTextCharFormat *in_stack_ffffffffffffffa8;
  QList<QTextCharFormat> *this_00;
  int local_40;
  qsizetype local_18;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QSyntaxHighlighter *)0x79b142);
  if ((-1 < in_ESI) &&
     (qVar2 = QList<QTextCharFormat>::size(&pQVar1->formatChanges), in_ESI < qVar2)) {
    local_c = in_ESI + in_EDX;
    local_18 = QList<QTextCharFormat>::size(&pQVar1->formatChanges);
    PVar3 = qMin<int,long_long>(&local_c,&local_18);
    for (local_40 = in_ESI; local_40 < (int)PVar3; local_40 = local_40 + 1) {
      this_00 = in_RCX;
      QList<QTextCharFormat>::operator[](in_RCX,(qsizetype)in_stack_ffffffffffffffa8);
      QTextCharFormat::operator=((QTextCharFormat *)this_00,in_stack_ffffffffffffffa8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSyntaxHighlighter::setFormat(int start, int count, const QTextCharFormat &format)
{
    Q_D(QSyntaxHighlighter);
    if (start < 0 || start >= d->formatChanges.size())
        return;

    const int end = qMin(start + count, d->formatChanges.size());
    for (int i = start; i < end; ++i)
        d->formatChanges[i] = format;
}